

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  bool bVar1;
  ostream *poVar2;
  string name;
  ostringstream oss;
  string sStack_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  TestCase local_2a8;
  ostringstream local_190 [376];
  
  std::__cxx11::string::string((string *)&local_2c8,(string *)testCase);
  bVar1 = std::operator==(&local_2c8,"");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"Anonymous test case ");
    this->m_unnamedCount = this->m_unnamedCount + 1;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__cxx11::stringbuf::str();
    TestCase::withName(&local_2a8,testCase,&sStack_2e8);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_2a8);
    TestCase::~TestCase(&local_2a8);
    std::__cxx11::string::~string((string *)&sStack_2e8);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else {
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functions,testCase);
  }
  std::__cxx11::string::~string((string *)&local_2c8);
  return;
}

Assistant:

virtual void registerTest( TestCase const& testCase ) {
            std::string name = testCase.getTestCaseInfo().name;
            if( name == "" ) {
                std::ostringstream oss;
                oss << "Anonymous test case " << ++m_unnamedCount;
                return registerTest( testCase.withName( oss.str() ) );
            }
            m_functions.push_back( testCase );
        }